

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapePoolingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  uint32 uVar1;
  int iVar2;
  LogMessage *pLVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar4;
  ShapeRange *pSVar5;
  LayerUnion LVar6;
  BorderAmounts *pBVar7;
  runtime_error *this_02;
  PoolingLayerParams_ValidCompletePadding *pPVar8;
  size_t sVar9;
  size_t sVar10;
  ValidPadding *pVVar11;
  long lVar12;
  LogMessage *__return_storage_ptr__;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int local_2b4;
  int local_2a0;
  LogMessage local_288;
  LogMessage local_250;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  LogMessage local_1d8;
  LogMessage local_1a0;
  ShapeRange local_168;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_110);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar4 = ShapeConstraint::sequenceRange(this_01);
  pSVar5 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_288,pSVar4,pSVar5);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_288);
  pSVar4 = ShapeConstraint::batchRange(this_01);
  pSVar5 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_288,pSVar4,pSVar5);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&local_288);
  pSVar4 = ShapeConstraint::channelRange(this_00);
  ShapeConstraint::updateChannelRange(this_01,pSVar4);
  pSVar4 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar4);
  pSVar4 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar4);
  pSVar4 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar4);
  if (specLayer->_oneof_case_[0] == 0x78) {
    LVar6 = specLayer->layer_;
  }
  else {
    LVar6.pooling_ = Specification::PoolingLayerParams::default_instance();
  }
  iVar17 = 3;
  local_2a0 = 3;
  if (((LVar6.convolution_)->kernelsize_).current_size_ == 2) {
    local_2a0 = *(int *)&((LVar6.innerproduct_)->bias_->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                         .ptr_;
    if (((LVar6.convolution_)->kernelsize_).current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x472);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    iVar17 = ((LVar6.innerproduct_)->bias_->floatvalue_).current_size_;
  }
  iVar13 = 1;
  iVar14 = 1;
  if (((LVar6.convolution_)->stride_).current_size_ == 2) {
    iVar14 = *(int *)&((LVar6.cropresize_)->boxindicesmode_->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                      .ptr_;
    if (((LVar6.convolution_)->stride_).current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x472);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar13 = (LVar6.cropresize_)->boxindicesmode_->boxmode_;
  }
  if ((LVar6.pooling_)->globalpooling_ == true) {
    ShapeConstraint::setHeight(this_01,1);
    ShapeConstraint::setWidth(this_01,1);
  }
  else {
    uVar1 = (LVar6.scale_)->_cached_size_;
    if ((int)uVar1 < 0x1f) {
      if (uVar1 != 0x1e) {
        if (uVar1 != 0) {
          return;
        }
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"Pooling padding type not set");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pBVar7 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->valid_->paddingamounts_;
      if (pBVar7 == (BorderAmounts *)0x0) {
        pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
      }
      local_2b4 = 0;
      iVar16 = 0;
      iVar15 = 0;
      if ((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 2) {
        if ((LVar6.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->valid_;
        }
        else {
          pVVar11 = Specification::ValidPadding::default_instance();
        }
        pBVar7 = pVVar11->paddingamounts_;
        if (pBVar7 == (BorderAmounts *)0x0) {
          pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_1a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar3 = google::protobuf::internal::LogMessage::operator<<
                             (&local_1a0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
          google::protobuf::internal::LogMessage::~LogMessage(&local_1a0);
        }
        iVar2 = *(int *)((long)((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements
                               [0] + 0x10);
        if ((LVar6.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->valid_;
        }
        else {
          pVVar11 = Specification::ValidPadding::default_instance();
        }
        pBVar7 = pVVar11->paddingamounts_;
        if (pBVar7 == (BorderAmounts *)0x0) {
          pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)(local_1f8 + 0x20),LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar3 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)(local_1f8 + 0x20),
                              "CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)(local_1f8 + 0x20));
        }
        iVar15 = *(int *)((long)((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x18);
        if ((LVar6.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->valid_;
        }
        else {
          pVVar11 = Specification::ValidPadding::default_instance();
        }
        pBVar7 = pVVar11->paddingamounts_;
        if (pBVar7 == (BorderAmounts *)0x0) {
          pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_250,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar3 = google::protobuf::internal::LogMessage::operator<<
                             (&local_250,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
          google::protobuf::internal::LogMessage::~LogMessage(&local_250);
        }
        local_2b4 = *(int *)(*(long *)((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1)
                            + 0x10);
        if ((LVar6.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->valid_;
        }
        else {
          pVVar11 = Specification::ValidPadding::default_instance();
        }
        pBVar7 = pVVar11->paddingamounts_;
        if (pBVar7 == (BorderAmounts *)0x0) {
          pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_288,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar3 = google::protobuf::internal::LogMessage::operator<<
                             (&local_288,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1f8,pLVar3);
          google::protobuf::internal::LogMessage::~LogMessage(&local_288);
        }
        iVar16 = *(int *)(*(long *)((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) +
                         0x18);
        iVar15 = iVar15 + iVar2;
      }
      if (0 < local_2a0 - iVar15) {
        pSVar4 = ShapeConstraint::heightRange(this_01);
        sVar9 = ShapeRange::minimumValue(pSVar4);
        if (sVar9 == 0) {
          lVar12 = 0;
        }
        else {
          pSVar4 = ShapeConstraint::heightRange(this_01);
          sVar9 = ShapeRange::minimumValue(pSVar4);
          lVar12 = sVar9 - 1;
        }
        ShapeConstraint::lowerBoundHeight
                  (this_00,(ulong)(uint)(local_2a0 - iVar15) + iVar14 * lVar12);
      }
      pSVar4 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator+(&local_168,pSVar4,iVar15 - local_2a0);
      ShapeRange::operator/((ShapeRange *)local_218,&local_168,(long)iVar14);
      ShapeRange::operator+((ShapeRange *)local_1f8,(ShapeRange *)local_218,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)local_1f8);
      uVar18 = iVar17 - (iVar16 + local_2b4);
      if (0 < (int)uVar18) {
        pSVar4 = ShapeConstraint::widthRange(this_01);
        sVar9 = ShapeRange::minimumValue(pSVar4);
        if (sVar9 == 0) {
          lVar12 = 0;
        }
        else {
          pSVar4 = ShapeConstraint::widthRange(this_01);
          sVar9 = ShapeRange::minimumValue(pSVar4);
          lVar12 = sVar9 - 1;
        }
        ShapeConstraint::lowerBoundWidth(this_00,(ulong)uVar18 + iVar13 * lVar12);
      }
      pSVar4 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator+(&local_168,pSVar4,(iVar16 + local_2b4) - iVar17);
      pLVar3 = (LogMessage *)local_218;
      ShapeRange::operator/((ShapeRange *)pLVar3,&local_168,(long)iVar13);
      __return_storage_ptr__ = (LogMessage *)local_1f8;
    }
    else {
      if (uVar1 != 0x1f) {
        if (uVar1 != 0x20) {
          return;
        }
        local_2b4 = 0;
        iVar16 = 0;
        iVar15 = 0;
        if (((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->same_->asymmetrymode_ == 2) {
          if ((LVar6.pooling_)->_oneof_case_[0] == 0x20) {
            pPVar8 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->includelastpixel_;
          }
          else {
            pPVar8 = Specification::PoolingLayerParams_ValidCompletePadding::default_instance();
          }
          if ((pPVar8->paddingamounts_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_250,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x472);
            pLVar3 = google::protobuf::internal::LogMessage::operator<<
                               (&local_250,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar3);
            google::protobuf::internal::LogMessage::~LogMessage(&local_250);
          }
          iVar15 = (int)((pPVar8->paddingamounts_).rep_)->elements[0];
          if ((LVar6.pooling_)->_oneof_case_[0] == 0x20) {
            pPVar8 = ((PoolingPaddingTypeUnion *)&(LVar6.scale_)->bias_)->includelastpixel_;
          }
          else {
            pPVar8 = Specification::PoolingLayerParams_ValidCompletePadding::default_instance();
          }
          if ((pPVar8->paddingamounts_).current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_288,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x472);
            pLVar3 = google::protobuf::internal::LogMessage::operator<<
                               (&local_288,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=
                      ((LogFinisher *)(local_1f8 + 0x20),pLVar3);
            google::protobuf::internal::LogMessage::~LogMessage(&local_288);
          }
          iVar16 = *(int *)&(pPVar8->paddingamounts_).rep_[1].arena;
        }
        if (iVar15 != 0 || iVar16 != 0) {
          sVar9 = ShapeConstraint::minimumHeight(this_00);
          sVar10 = ShapeConstraint::minimumHeight(this_00);
          local_2b4 = -(uint)((int)sVar10 + iVar15 <=
                             ((iVar14 + iVar15) * 2 - local_2a0) + (int)sVar9 + -2);
        }
        pSVar4 = ShapeConstraint::heightRange(this_00);
        ShapeRange::operator+((ShapeRange *)local_218,pSVar4,-(local_2a0 + iVar15 * -2));
        ShapeRange::divideAndRoundUp((ShapeRange *)local_1f8,(ShapeRange *)local_218,(long)iVar14);
        ShapeRange::operator+((ShapeRange *)&local_1a0,(ShapeRange *)local_1f8,1);
        ShapeRange::operator+((ShapeRange *)(local_1f8 + 0x20),(ShapeRange *)&local_1a0,local_2b4);
        ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)(local_1f8 + 0x20));
        uVar18 = local_2a0 + iVar15 * -2;
        if (uVar18 != 0 && SBORROW4(local_2a0,iVar15 * 2) == (int)uVar18 < 0) {
          pSVar4 = ShapeConstraint::heightRange(this_01);
          sVar9 = ShapeRange::minimumValue(pSVar4);
          ShapeConstraint::lowerBoundHeight(this_00,(uVar18 + sVar9) - 1);
        }
        if (iVar15 == 0 && iVar16 == 0) {
          iVar14 = 0;
        }
        else {
          sVar9 = ShapeConstraint::minimumWidth(this_00);
          sVar10 = ShapeConstraint::minimumWidth(this_00);
          iVar14 = -(uint)((int)sVar10 + iVar16 <=
                          (int)sVar9 + ((iVar16 + iVar13) * 2 - iVar17) + -2);
        }
        pSVar4 = ShapeConstraint::widthRange(this_00);
        ShapeRange::operator+((ShapeRange *)local_218,pSVar4,-(iVar17 + iVar16 * -2));
        ShapeRange::divideAndRoundUp((ShapeRange *)local_1f8,(ShapeRange *)local_218,(long)iVar13);
        ShapeRange::operator+((ShapeRange *)&local_1a0,(ShapeRange *)local_1f8,1);
        ShapeRange::operator+((ShapeRange *)(local_1f8 + 0x20),(ShapeRange *)&local_1a0,iVar14);
        ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)(local_1f8 + 0x20));
        uVar18 = iVar17 + iVar16 * -2;
        if (uVar18 == 0 || SBORROW4(iVar17,iVar16 * 2) != (int)uVar18 < 0) {
          return;
        }
        pSVar4 = ShapeConstraint::widthRange(this_01);
        sVar9 = ShapeRange::minimumValue(pSVar4);
        ShapeConstraint::lowerBoundHeight(this_00,(uVar18 + sVar9) - 1);
        return;
      }
      pSVar4 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator-((ShapeRange *)(local_1f8 + 0x20),pSVar4,1);
      ShapeRange::operator/((ShapeRange *)&local_250,(ShapeRange *)(local_1f8 + 0x20),(long)iVar14);
      ShapeRange::operator+((ShapeRange *)&local_288,(ShapeRange *)&local_250,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_288);
      pSVar4 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator-((ShapeRange *)(local_1f8 + 0x20),pSVar4,1);
      pLVar3 = &local_250;
      ShapeRange::operator/((ShapeRange *)pLVar3,(ShapeRange *)(local_1f8 + 0x20),(long)iVar13);
      __return_storage_ptr__ = &local_288;
    }
    ShapeRange::operator+((ShapeRange *)__return_storage_ptr__,(ShapeRange *)pLVar3,1);
    ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)__return_storage_ptr__);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapePoolingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(inputShape.channelRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    const Specification::PoolingLayerParams& pool = specLayer.pooling();

    int Kh, Kw, hstride, wstride;
    Kh = Kw = 3;
    hstride = wstride = 1;
    if (pool.kernelsize_size() == 2){
        Kh = static_cast<int>(pool.kernelsize(0)); //height
        Kw = static_cast<int>(pool.kernelsize(1)); //width
    }
    if (pool.stride_size() == 2){
        hstride = static_cast<int>(pool.stride(0)); //height
        wstride = static_cast<int>(pool.stride(1)); //width
    }

    int l, r, b, t;
    l = r = b = t = 0;

    if (pool.globalpooling()) {
        outputShape.setHeight(1);
        outputShape.setWidth(1);
    } else {
        switch (pool.PoolingPaddingType_case()) {
            case Specification::PoolingLayerParams::kValid:
                if (pool.valid().paddingamounts().borderamounts_size() == 2){
                    t = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).startedgesize());
                    b = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).endedgesize());
                    l = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).startedgesize());
                    r = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).endedgesize());
                }

                if (Kh - b - t > 0) {
                    size_t inputLowerBound = outputShape.heightRange().minimumValue() == 0 ? 0 : (outputShape.heightRange().minimumValue() - 1);
                    inputShape.lowerBoundHeight(inputLowerBound * static_cast<size_t>(hstride) + static_cast<size_t>(Kh - b - t));
//                    inputShape.lowerBoundHeight(inputLowerBound + static_cast<size_t>(Kh - b - t));
                }

                outputShape.updateHeightRange((inputShape.heightRange() + (t + b - Kh))/static_cast<size_t>(hstride) + 1);

                if (Kw - l - r > 0) {
                    size_t inputLowerBound = outputShape.widthRange().minimumValue() == 0 ? 0 : (outputShape.widthRange().minimumValue() - 1);
                    inputShape.lowerBoundWidth(inputLowerBound * static_cast<size_t>(wstride) + static_cast<size_t>(Kw - l - r));
//                    inputShape.lowerBoundWidth(inputLowerBound + static_cast<size_t>(Kw - l - r));
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (r + l - Kw))/static_cast<size_t>(wstride) + 1);

                break;
            case Specification::PoolingLayerParams::kSame:
                // needs to round up
                outputShape.updateHeightRange((inputShape.heightRange() - 1)/ static_cast<size_t>(hstride) + 1);
                outputShape.updateWidthRange((inputShape.widthRange() - 1) / static_cast<size_t>(wstride) + 1);
                break;
            case Specification::PoolingLayerParams::kIncludeLastPixel: {
                if (pool.includelastpixel().paddingamounts_size() == 2){
                    t = static_cast<int>(pool.includelastpixel().paddingamounts(0));
                    l = static_cast<int>(pool.includelastpixel().paddingamounts(1));
                }
                // subtracting in the numerator and adding 1 in order to get integer division rounded up
                int addExtra = 0;
                if (t || l) {
                    if ((static_cast<int>(inputShape.minimumHeight()) - 1 + (2*t - Kh - 1) + 2 * hstride) >= (static_cast<int>(inputShape.minimumHeight()) + t)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateHeightRange((inputShape.heightRange() + (2*t - Kh)).divideAndRoundUp(static_cast<size_t>(hstride)) + 1 + addExtra);
                if (Kh - 2*t > 0)
                    inputShape.lowerBoundHeight(outputShape.heightRange().minimumValue() - 1 + static_cast<size_t>(Kh - 2*t));

                addExtra = 0;
                if (t || l){
                    if ((static_cast<int>(inputShape.minimumWidth()) - 1 + (2*l - Kw - 1) + 2 * wstride) >= (static_cast<int>(inputShape.minimumWidth()) + l)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (2*l - Kw)).divideAndRoundUp(static_cast<size_t>(wstride)) + 1 + addExtra);
                if (Kw - 2*l > 0)
                    inputShape.lowerBoundHeight(outputShape.widthRange().minimumValue() - 1 + static_cast<size_t>(Kw - 2*l));
                break;
            }
            case Specification::PoolingLayerParams::POOLINGPADDINGTYPE_NOT_SET:
                throw std::runtime_error("Pooling padding type not set");
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}